

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DestroyContext(ImGuiContext *ctx)

{
  undefined8 local_20;
  ImGuiContext *prev_ctx;
  ImGuiContext *ctx_local;
  
  local_20 = GetCurrentContext();
  prev_ctx = ctx;
  if (ctx == (ImGuiContext *)0x0) {
    prev_ctx = local_20;
  }
  SetCurrentContext(prev_ctx);
  Shutdown();
  if (local_20 == prev_ctx) {
    local_20 = (ImGuiContext *)0x0;
  }
  SetCurrentContext(local_20);
  IM_DELETE<ImGuiContext>(prev_ctx);
  return;
}

Assistant:

void ImGui::DestroyContext(ImGuiContext* ctx)
{
    ImGuiContext* prev_ctx = GetCurrentContext();
    if (ctx == NULL) //-V1051
        ctx = prev_ctx;
    SetCurrentContext(ctx);
    Shutdown();
    SetCurrentContext((prev_ctx != ctx) ? prev_ctx : NULL);
    IM_DELETE(ctx);
}